

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

floatx80 floatx80_getman_m68k(floatx80 a,float_status *status)

{
  uint64_t uVar1;
  uint uVar2;
  floatx80 fVar3;
  floatx80 fVar4;
  int32_t aExp;
  uint64_t aSig;
  uint local_1c;
  uint64_t local_18;
  
  fVar3.low = a.low;
  local_1c = a._8_4_ & 0x7fff;
  local_18 = fVar3.low;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
    if (fVar3.low == 0) {
      uVar2 = a._8_4_ & 0x8000;
      uVar1 = 0;
      goto LAB_006ef6e0;
    }
    normalizeFloatx80Subnormal_m68k(fVar3.low,(int32_t *)&local_1c,&local_18);
  }
  else if (local_1c == 0x7fff) {
    if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0) {
      fVar3._8_8_ = a._8_8_ & 0xffffffff;
      fVar3 = propagateFloatx80NaNOneArg(fVar3,status);
      return fVar3;
    }
    float_raise_m68k('\x01',status);
    fVar3 = floatx80_default_nan_m68k(status);
    return fVar3;
  }
  fVar3 = roundAndPackFloatx80_m68k
                    (status->floatx80_rounding_precision,(flag)((a._8_8_ & 0xffff) >> 0xf),0x3fff,
                     local_18,0,status);
  uVar1 = fVar3.low;
  uVar2 = fVar3._8_4_;
LAB_006ef6e0:
  fVar4._8_4_ = uVar2;
  fVar4.low = uVar1;
  fVar4._12_4_ = 0;
  return fVar4;
}

Assistant:

floatx80 floatx80_getman(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig;

    aSig = extractFloatx80Frac(a);
    aExp = extractFloatx80Exp(a);
    aSign = extractFloatx80Sign(a);

    if (aExp == 0x7FFF) {
        if ((uint64_t) (aSig << 1)) {
            return propagateFloatx80NaNOneArg(a , status);
        }
        float_raise(float_flag_invalid , status);
        return floatx80_default_nan(status);
    }

    if (aExp == 0) {
        if (aSig == 0) {
            return packFloatx80(aSign, 0, 0);
        }
        normalizeFloatx80Subnormal(aSig, &aExp, &aSig);
    }

    return roundAndPackFloatx80(status->floatx80_rounding_precision, aSign,
                                0x3FFF, aSig, 0, status);
}